

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O2

Slice * Imf_2_5::Slice::Make
                  (Slice *__return_storage_ptr__,PixelType type,void *ptr,V2i *origin,int64_t w,
                  int64_t h,size_t xStride,size_t yStride,int xSampling,int ySampling,
                  double fillValue,bool xTileCoords,bool yTileCoords)

{
  ArgExc *this;
  size_t sStack_1b0;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  if (xStride == 0) {
    switch(type) {
    case UINT:
    case FLOAT:
      sStack_1b0 = 4;
      xStride = sStack_1b0;
      break;
    case HALF:
      sStack_1b0 = 2;
      xStride = sStack_1b0;
      break;
    case NUM_PIXELTYPES:
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      std::operator<<(local_198,"Invalid pixel type.");
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this,(stringstream *)&_iex_throw_s);
      __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    default:
      xStride = 0;
    }
  }
  if (yStride == 0) {
    yStride = (w / (long)xSampling) * xStride;
  }
  Slice(__return_storage_ptr__,type,
        (char *)((long)ptr +
                (-(((long)origin->y / (long)ySampling) * yStride) -
                ((long)origin->x / (long)xSampling) * xStride)),xStride,yStride,xSampling,ySampling,
        fillValue,SUB41(ySampling,0),yTileCoords);
  return __return_storage_ptr__;
}

Assistant:

Slice
Slice::Make (
    PixelType                   type,
    const void*                 ptr,
    const IMATH_NAMESPACE::V2i& origin,
    int64_t                     w,
    int64_t                     h,
    size_t                      xStride,
    size_t                      yStride,
    int                         xSampling,
    int                         ySampling,
    double                      fillValue,
    bool                        xTileCoords,
    bool                        yTileCoords)
{
    char* base = reinterpret_cast<char*> (const_cast<void *> (ptr));
    if (xStride == 0)
    {
        switch (type)
        {
            case UINT: xStride = sizeof (uint32_t); break;
            case HALF: xStride = sizeof (uint16_t); break;
            case FLOAT: xStride = sizeof (float); break;
            case NUM_PIXELTYPES:
                THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel type.");
        }
    }
    if (yStride == 0)
        yStride = static_cast<size_t> (w / xSampling) * xStride;

    // data window is an int, so force promote to higher type to avoid
    // overflow for off y (degenerate size checks should be in
    // ImfHeader::sanityCheck, but offset can be large-ish)
    int64_t offx = (static_cast<int64_t> (origin.x) /
                    static_cast<int64_t> (xSampling));
    offx *= static_cast<int64_t> (xStride);

    int64_t offy = (static_cast<int64_t> (origin.y) /
                    static_cast<int64_t> (ySampling));
    offy *= static_cast<int64_t> (yStride);

    return Slice (
        type,
        base - offx - offy,
        xStride,
        yStride,
        xSampling,
        ySampling,
        fillValue,
        xTileCoords,
        yTileCoords);
}